

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

bool __thiscall
gl4cts::GPUShaderFP64Test6::executeIteration(GPUShaderFP64Test6 *this,_test_case *test_case)

{
  GLuint GVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_t sVar5;
  bool *__s;
  char *__s_00;
  long lVar6;
  bool bVar7;
  GLint compile_status;
  int local_1cc;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  local_1c8._0_4_ = this->m_cs_id;
  local_1c8._4_4_ = this->m_fs_id;
  uStack_1c0._0_4_ = this->m_gs_id;
  uStack_1c0._4_4_ = this->m_tc_id;
  local_1b8._0_4_ = this->m_te_id;
  local_1b8._4_4_ = this->m_vs_id;
  bVar7 = true;
  lVar6 = 0;
  do {
    GVar1 = *(GLuint *)((long)&local_1c8 + lVar6 * 4);
    if (GVar1 != 0) {
      (**(code **)(lVar4 + 0x248))(GVar1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x206b);
      local_1cc = 1;
      (**(code **)(lVar4 + 0xa70))(GVar1,0x8b81,&local_1cc);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                      ,0x2071);
      if (local_1cc == 1) {
        if (GVar1 == this->m_cs_id) {
          __s = (bool *)(test_case->cs_shader_body)._M_dataplus._M_p;
          __s_00 = "Compute shader";
        }
        else if (GVar1 == this->m_fs_id) {
          __s = (bool *)(test_case->fs_shader_body)._M_dataplus._M_p;
          __s_00 = "Fragment shader";
        }
        else if (GVar1 == this->m_gs_id) {
          __s = (bool *)(test_case->gs_shader_body)._M_dataplus._M_p;
          __s_00 = "Geometry shader";
        }
        else if (GVar1 == this->m_tc_id) {
          __s = (bool *)(test_case->tc_shader_body)._M_dataplus._M_p;
          __s_00 = "Tessellation control shader";
        }
        else if (GVar1 == this->m_te_id) {
          __s = (bool *)(test_case->te_shader_body)._M_dataplus._M_p;
          __s_00 = "Tessellation evaluation shader";
        }
        else {
          bVar7 = GVar1 != this->m_vs_id;
          __s = (bool *)(test_case->vs_shader_body)._M_dataplus._M_p;
          if (bVar7) {
            __s = ::glcts::fixed_sample_locations_values + 1;
          }
          __s_00 = "[?]";
          if (!bVar7) {
            __s_00 = "Vertex shader";
          }
        }
        local_1b0 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        sVar5 = strlen(__s_00);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s_00,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,
                   " has been compiled successfully, even though the shader was malformed. Following is shader body:\n"
                   ,0x61);
        if (__s == (bool *)0x0) {
          std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
        }
        else {
          sVar5 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar5);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar7 = false;
      }
    }
    lVar6 = lVar6 + 1;
  } while (lVar6 != 6);
  return bVar7;
}

Assistant:

bool GPUShaderFP64Test6::executeIteration(const _test_case& test_case)
{
	const glw::Functions& gl		 = m_context.getRenderContext().getFunctions();
	const glw::GLuint	 so_ids[]   = { m_cs_id, m_fs_id, m_gs_id, m_tc_id, m_te_id, m_vs_id };
	const unsigned int	n_so_ids   = sizeof(so_ids) / sizeof(so_ids[0]);
	bool				  result	 = true;
	const char*			  stage_body = NULL;
	const char*			  stage_name = NULL;

	for (unsigned int n_so_id = 0; n_so_id < n_so_ids; ++n_so_id)
	{
		const glw::GLuint so_id = so_ids[n_so_id];

		/* Skip compute shader if it is not supported */
		if (0 == so_id)
		{
			continue;
		}

		/* Compile the shader */
		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		/* Has the compilation failed as expected? */
		glw::GLint compile_status = GL_TRUE;

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		if (compile_status == GL_TRUE)
		{
			/* What is the current stage's name? */
			if (so_id == m_cs_id)
			{
				stage_body = test_case.cs_shader_body.c_str();
				stage_name = "Compute shader";
			}
			else if (so_id == m_fs_id)
			{
				stage_body = test_case.fs_shader_body.c_str();
				stage_name = "Fragment shader";
			}
			else if (so_id == m_gs_id)
			{
				stage_body = test_case.gs_shader_body.c_str();
				stage_name = "Geometry shader";
			}
			else if (so_id == m_tc_id)
			{
				stage_body = test_case.tc_shader_body.c_str();
				stage_name = "Tessellation control shader";
			}
			else if (so_id == m_te_id)
			{
				stage_body = test_case.te_shader_body.c_str();
				stage_name = "Tessellation evaluation shader";
			}
			else if (so_id == m_vs_id)
			{
				stage_body = test_case.vs_shader_body.c_str();
				stage_name = "Vertex shader";
			}
			else
			{
				/* Doesn't make much sense to throw exceptions here so.. */
				stage_body = "";
				stage_name = "[?]";
			}

			/* This shader should have never compiled successfully! */
			m_testCtx.getLog() << tcu::TestLog::Message << stage_name
							   << " has been compiled successfully, even though the shader was malformed."
								  " Following is shader body:\n"
							   << stage_body << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all shader objects) */

	return result;
}